

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::adc_a_h(CPU *this)

{
  adc_r8_r8(this,&this->regs->a,this->regs->h);
  return 1;
}

Assistant:

int CPU::adc_a_h() {
    adc_r8_r8(regs.a, regs.h);
    return 1;
}